

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffukfm(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    iVar1 = ffmkfm(fptr,keyname,value,decim,comm,status);
    if (iVar1 == 0xca) {
      *status = iVar2;
      ffpkfm(fptr,keyname,value,decim,comm,status);
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffukfm(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           double *value,      /* I - keyword value      */
           int decim,          /* I - no of decimals     */
           const char *comm,   /* I - keyword comment    */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkfm(fptr, keyname, value, decim, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkfm(fptr, keyname, value, decim, comm, status);
    }
    return(*status);
}